

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.cpp
# Opt level: O3

void __thiscall
TreePropagator::DFSPink
          (TreePropagator *this,int r,vector<bool,_std::allocator<bool>_> *visited,
          vector<bool,_std::allocator<bool>_> *blue,
          unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> *badEdges)

{
  ulong *puVar1;
  pointer pvVar2;
  int *piVar3;
  BoolView *pBVar4;
  bool bVar5;
  int iVar6;
  pointer piVar7;
  _Bit_type *p_Var8;
  ulong uVar9;
  ulong uVar10;
  int iVar11;
  long lVar12;
  ulong uVar13;
  ulong uVar14;
  int e;
  __hashtable *__h;
  uint local_4c;
  _Hashtable<int,int,std::allocator<int>,std::__detail::_Identity,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
  *local_48;
  vector<bool,_std::allocator<bool>_> *local_40;
  _Hashtable<int,int,std::allocator<int>,std::__detail::_Identity,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
  *local_38;
  
  uVar9 = (ulong)r;
  iVar6 = r + 0x3f;
  if (-1 < r) {
    iVar6 = r;
  }
  puVar1 = (visited->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
           _M_start.super__Bit_iterator_base._M_p +
           (long)(iVar6 >> 6) +
           (ulong)((uVar9 & 0x800000000000003f) < 0x8000000000000001) + 0xffffffffffffffff;
  *puVar1 = *puVar1 | 1L << ((byte)r & 0x3f);
  pvVar2 = (this->super_GraphPropagator).adj.
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  piVar7 = pvVar2[uVar9].super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (*(pointer *)
       ((long)&pvVar2[uVar9].super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data + 8) != piVar7) {
    uVar10 = 0;
    uVar14 = 1;
    local_48 = (_Hashtable<int,int,std::allocator<int>,std::__detail::_Identity,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                *)badEdges;
    local_40 = visited;
    do {
      local_4c = piVar7[uVar10];
      piVar3 = (this->super_GraphPropagator).endnodes.
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[(int)local_4c].
               super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start;
      iVar6 = *piVar3;
      if (iVar6 == r) {
        iVar6 = piVar3[1];
      }
      pBVar4 = (this->super_GraphPropagator).es.data;
      uVar10 = (ulong)iVar6;
      if (sat.assigns.data[(uint)pBVar4[local_4c].v] == '\0') {
        p_Var8 = (blue->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data
                 ._M_start.super__Bit_iterator_base._M_p;
LAB_00170c58:
        iVar11 = iVar6 + 0x3f;
        if (-1 < iVar6) {
          iVar11 = iVar6;
        }
        uVar13 = (ulong)((uVar10 & 0x800000000000003f) < 0x8000000000000001);
        lVar12 = (long)(iVar11 >> 6);
        if ((p_Var8[lVar12 + uVar13 + 0xffffffffffffffff] >> (uVar10 & 0x3f) & 1) == 0) {
LAB_00170c8d:
          if (((local_40->super__Bvector_base<std::allocator<bool>_>)._M_impl.
               super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
               [lVar12 + uVar13 + 0xffffffffffffffff] & 1L << ((byte)iVar6 & 0x3f)) == 0) {
            DFSPink(this,iVar6,local_40,blue,
                    (unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> *)
                    local_48);
          }
        }
      }
      else {
        p_Var8 = (blue->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data
                 ._M_start.super__Bit_iterator_base._M_p;
        if ((uint)pBVar4[local_4c].s * 2 + -1 != (int)sat.assigns.data[(uint)pBVar4[local_4c].v])
        goto LAB_00170c58;
        iVar11 = iVar6 + 0x3f;
        if (-1 < iVar6) {
          iVar11 = iVar6;
        }
        uVar13 = (ulong)((uVar10 & 0x800000000000003f) < 0x8000000000000001);
        lVar12 = (long)(iVar11 >> 6);
        if ((p_Var8[lVar12 + uVar13 + 0xffffffffffffffff] >> (uVar10 & 0x3f) & 1) == 0)
        goto LAB_00170c8d;
        local_38 = local_48;
        std::
        _Hashtable<int,int,std::allocator<int>,std::__detail::_Identity,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
        ::
        _M_insert<int_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<int,false>>>>
                  (local_48,&local_4c,&local_38);
      }
      pvVar2 = (this->super_GraphPropagator).adj.
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      piVar7 = pvVar2[uVar9].super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      bVar5 = uVar14 < (ulong)((long)*(pointer *)
                                      ((long)&pvVar2[uVar9].
                                              super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                              super__Vector_impl_data + 8) - (long)piVar7 >> 2);
      uVar10 = uVar14;
      uVar14 = (ulong)((int)uVar14 + 1);
    } while (bVar5);
  }
  return;
}

Assistant:

void TreePropagator::DFSPink(int r, std::vector<bool>& visited, std::vector<bool>& blue,
														 std::unordered_set<edge_id>& badEdges) {
	visited[r] = true;
	for (unsigned int i = 0; i < adj[r].size(); i++) {
		const int e = adj[r][i];
		const int e1 = getEndnode(e, 1);
		const int e0 = getEndnode(e, 0);
		const int other = e0 == r ? e1 : e0;
		if (getEdgeVar(e).isFixed() && getEdgeVar(e).isFalse()) {
			if (blue[other]) {
				badEdges.insert(e);
				continue;
			}
		} else if (blue[other]) {
			continue;
		}
		if (visited[other] == false) {
			DFSPink(other, visited, blue, badEdges);
		}
	}
}